

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O1

K __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_min(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
             *this)

{
  long lVar1;
  size_t sVar2;
  ulong *puVar3;
  bool *pbVar4;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar5;
  undefined8 uStack_818;
  RBPath local_810;
  
  if ((this->root).unsafe_capptr <
      (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)0x2) {
    pFVar5 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x0;
  }
  else {
    lVar1 = 8;
    do {
      *(undefined8 *)((long)local_810.path._M_elems + lVar1 + -8) = 0;
      *(undefined1 *)((long)&local_810.path._M_elems[0].node.ptr.val + lVar1) = 0;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x808);
    local_810.path._M_elems[0].node.ptr.val = (H)(H)this;
    local_810.path._M_elems[0].dir = false;
    puVar3 = (ulong *)((ulong)(this->root).unsafe_capptr & 0xfffffffffffffffe);
    sVar2 = 1;
    if (1 < *puVar3) {
      pbVar4 = &local_810.path._M_elems[1].dir;
      do {
        (((RBStep *)(pbVar4 + -8))->node).ptr.val = puVar3;
        *pbVar4 = true;
        sVar2 = sVar2 + 1;
        puVar3 = (ulong *)(*puVar3 & 0xfffffffffffffffe);
        pbVar4 = pbVar4 + 0x10;
      } while (1 < *puVar3);
    }
    local_810.length = sVar2;
    pFVar5 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)(*local_810.path._M_elems[sVar2 - 1].node.ptr.val & 0xfffffffffffffffe);
    remove_path(this,&local_810);
  }
  return (K)pFVar5;
}

Assistant:

void fixup(bool expected = true)
      {
        if (!run_checks && !expected)
          return;

        // During a splice in remove the path can be invalidated,
        // this refreshs the path so that the it refers to the spliced
        // nodes fields.
        // TODO optimise usage to avoid traversing whole path.
        for (size_t i = 1; i < length; i++)
        {
          auto parent = path[i - 1].node;
          auto& curr = path[i].node;
          auto dir = path[i].dir;
          auto actual = get_dir(dir, parent);
          if (actual != curr)
          {
            if (!expected)
            {
              snmalloc::error("Performed an unexpected fixup.");
            }
            curr = actual;
          }
        }
      }